

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  AssertionResultData *pAVar1;
  OfType OVar2;
  pointer pMVar3;
  bool bVar4;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar5;
  ostream *os;
  Column local_c8;
  ReusableStringStream rss;
  string local_80;
  ScopedElement e;
  string elementName;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) != Ok) &&
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) {
    elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
    elementName._M_string_length = 0;
    elementName.field_2._M_local_buf[0] = '\0';
    if ((((uint)(OVar2 + ~FailureBit) < 2) ||
        (((OVar2 == Unknown || (OVar2 == FailureBit)) || (OVar2 == Exception)))) ||
       (((OVar2 == FatalErrorCondition || (OVar2 == DidntThrowException)) ||
        (OVar2 == ThrewException)))) {
      std::__cxx11::string::assign((char *)&elementName);
    }
    this_01 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_01,(XmlFormatting)&elementName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"message",(allocator<char> *)&rss);
    this_00 = &stats->assertionResult;
    AssertionResult::getExpression_abi_cxx11_(&local_80,this_00);
    XmlWriter::writeAttribute(this_01,(string *)&local_c8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"type",(allocator<char> *)&rss);
    local_80._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
    local_80._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)&local_c8,(StringRef *)&local_80);
    std::__cxx11::string::~string((string *)&local_c8);
    ReusableStringStream::ReusableStringStream(&rss);
    os = rss.m_oss;
    if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
        (stats->totals).assertions.failedButOk == 0) {
      std::operator<<(rss.m_oss,'\n');
    }
    else {
      std::operator<<(rss.m_oss,"FAILED");
      std::operator<<(os,":\n");
      if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
        std::operator<<(os,"  ");
        AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&local_c8,this_00);
        std::operator<<(os,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::operator<<(os,'\n');
      }
      bVar4 = AssertionResult::hasExpandedExpression(this_00);
      if (bVar4) {
        std::operator<<(os,"with expansion:\n");
        AssertionResult::getExpandedExpression_abi_cxx11_(&local_80,this_00);
        clara::TextFlow::Column::Column(&local_c8,&local_80);
        local_c8.m_indent = 2;
        clara::TextFlow::operator<<(os,&local_c8);
        std::operator<<(os,'\n');
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8.m_strings);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
    pAVar1 = &(stats->assertionResult).m_resultData;
    std::__cxx11::string::string((string *)&local_c8,(string *)pAVar1);
    std::__cxx11::string::~string((string *)&local_c8);
    if (local_c8.m_strings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::__cxx11::string::string((string *)&local_c8,(string *)pAVar1);
      std::operator<<(os,(string *)&local_c8);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)&local_c8);
    }
    pMVar3 = (stats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar5 = (stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      if (pMVar5->type == Info) {
        std::operator<<(os,(string *)&pMVar5->message);
        os = rss.m_oss;
        std::operator<<(rss.m_oss,'\n');
      }
    }
    std::operator<<(os,"at ");
    local_c8.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(stats->assertionResult).m_info.lineInfo.file;
    local_c8.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(stats->assertionResult).m_info.lineInfo.line;
    Catch::operator<<(os,(SourceLineInfo *)&local_c8);
    std::__cxx11::stringbuf::str();
    XmlWriter::writeText(this_01,(string *)&local_c8,Newline);
    std::__cxx11::string::~string((string *)&local_c8);
    ReusableStringStream::~ReusableStringStream(&rss);
    XmlWriter::ScopedElement::~ScopedElement(&e);
    std::__cxx11::string::~string((string *)&elementName);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }